

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::decompressTexture
               (vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                *levelDatas,
               vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
               *levelAccesses,RenderContext *renderContext,ImageInfo *info,
               vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               *data)

{
  bool bVar1;
  bool bVar2;
  int i;
  CompressedTexFormat format;
  ContextType ctxType;
  int iVar3;
  ContextInfo *this;
  long lVar4;
  long lVar5;
  TexDecompressionParams decompressParams;
  IVec3 levelPixelSize;
  CompressedTexFormat compressedFormat;
  IVec3 size;
  TextureFormat decompressedFormat;
  TexDecompressionParams local_84;
  ContextInfo *local_80;
  IVec3 local_78;
  int local_68;
  CompressedTexFormat local_64;
  undefined8 local_60;
  int local_58;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *local_50;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *local_48;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *local_40;
  TextureFormat local_38;
  
  local_50 = levelDatas;
  local_48 = levelAccesses;
  local_40 = data;
  format = glu::mapGLCompressedTexFormat(info->m_format);
  local_64 = format;
  local_38 = tcu::getUncompressedFormat(format);
  local_58 = (info->m_size).m_data[2];
  local_60 = *(undefined8 *)(info->m_size).m_data;
  ctxType.super_ApiType.m_bits = (ApiType)(*renderContext->_vptr_RenderContext[2])(renderContext);
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  this = glu::ContextInfo::create(renderContext);
  local_84.astcMode = ASTCMODE_LAST;
  local_80 = this;
  bVar2 = tcu::isAstcFormat(format);
  if (bVar2) {
    bVar2 = glu::ContextInfo::isExtensionSupported(this,"GL_KHR_texture_compression_astc_hdr");
    if (bVar2) {
      bVar2 = tcu::isAstcSRGBFormat(format);
      if (!bVar2) {
        local_84.astcMode = ASTCMODE_HDR;
        goto LAB_0063af56;
      }
    }
    if (!bVar1) {
      bVar1 = glu::ContextInfo::isExtensionSupported(this,"GL_KHR_texture_compression_astc_ldr");
      if (!bVar1) goto LAB_0063af56;
    }
    local_84.astcMode = ASTCMODE_LDR;
  }
LAB_0063af56:
  iVar3 = getLevelCount(info);
  std::
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ::resize(local_50,(long)iVar3);
  iVar3 = getLevelCount(info);
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::resize
            (local_48,(long)iVar3);
  iVar3 = getLevelCount(info);
  if (0 < iVar3) {
    local_68 = local_58;
    lVar5 = 0;
    do {
      local_78.m_data[2] = 0;
      local_78.m_data[0] = 0;
      local_78.m_data[1] = 0;
      if (info->m_target == 0x8c1a) {
        lVar4 = 0;
        do {
          iVar3 = *(int *)((long)&local_60 + lVar4 * 4) >> ((byte)lVar5 & 0x1f);
          if (iVar3 < 2) {
            iVar3 = 1;
          }
          local_78.m_data[lVar4] = iVar3;
          lVar4 = lVar4 + 1;
        } while (lVar4 == 1);
        local_78.m_data[2] = local_68;
      }
      else {
        lVar4 = 0;
        do {
          iVar3 = *(int *)((long)&local_60 + lVar4 * 4) >> ((byte)lVar5 & 0x1f);
          if (iVar3 < 2) {
            iVar3 = 1;
          }
          local_78.m_data[lVar4] = iVar3;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
      }
      decompressTextureLevel
                (&local_84,
                 (local_50->
                 super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + lVar5,
                 (local_48->
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 )._M_impl.super__Vector_impl_data._M_start + lVar5,&local_64,&local_38,&local_78,
                 (local_40->
                 super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[lVar5].m_ptr);
      lVar5 = lVar5 + 1;
      iVar3 = getLevelCount(info);
    } while (lVar5 < iVar3);
  }
  if (local_80 != (ContextInfo *)0x0) {
    (*local_80->_vptr_ContextInfo[1])();
  }
  return;
}

Assistant:

void decompressTexture (vector<ArrayBuffer<deUint8> >&			levelDatas,
						vector<tcu::PixelBufferAccess>&			levelAccesses,
						glu::RenderContext&						renderContext,
						const ImageInfo&						info,
						const vector<ArrayBuffer<deUint8> >&	data)
{
	const tcu::CompressedTexFormat	compressedFormat	= glu::mapGLCompressedTexFormat(info.getFormat());
	const tcu::TextureFormat		decompressedFormat	= tcu::getUncompressedFormat(compressedFormat);
	const IVec3						size				= info.getSize();
	const bool						isES32				= glu::contextSupports(renderContext.getType(), glu::ApiType::es(3, 2));

	de::UniquePtr<glu::ContextInfo>	ctxInfo				(glu::ContextInfo::create(renderContext));
	tcu::TexDecompressionParams		decompressParams;

	if (tcu::isAstcFormat(compressedFormat))
	{
		if (ctxInfo->isExtensionSupported("GL_KHR_texture_compression_astc_hdr") && !tcu::isAstcSRGBFormat(compressedFormat))
			decompressParams = tcu::TexDecompressionParams(tcu::TexDecompressionParams::ASTCMODE_HDR);
		else if (isES32 || ctxInfo->isExtensionSupported("GL_KHR_texture_compression_astc_ldr"))
			decompressParams = tcu::TexDecompressionParams(tcu::TexDecompressionParams::ASTCMODE_LDR);
		else
			DE_ASSERT(false);
	}

	levelDatas.resize(getLevelCount(info));
	levelAccesses.resize(getLevelCount(info));

	for (int level = 0; level < getLevelCount(info); level++)
	{
		const IVec3					levelPixelSize	= getLevelSize(info.getTarget(), size, level);
		de::ArrayBuffer<deUint8>&	levelData		= levelDatas[level];
		tcu::PixelBufferAccess&		levelAccess		= levelAccesses[level];

		decompressTextureLevel(decompressParams, levelData, levelAccess, compressedFormat, decompressedFormat, levelPixelSize, data[level].getPtr());
	}
}